

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O0

int __thiscall TCLAP::XorHandler::check(XorHandler *this,Arg *a)

{
  Arg *pAVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  iterator __first;
  iterator __last;
  CmdLineParseException *this_00;
  reference ppAVar7;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_d0;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_c8;
  ArgVectorIterator it_1;
  string local_b0;
  allocator local_79;
  string local_78;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_58;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_50;
  ArgVectorIterator it;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_30;
  ArgVectorIterator ait;
  Arg *pAStack_20;
  int i;
  Arg *a_local;
  XorHandler *this_local;
  
  ait._M_current._4_4_ = 0;
  pAStack_20 = a;
  a_local = (Arg *)this;
  while( true ) {
    uVar4 = (ulong)ait._M_current._4_4_;
    sVar5 = std::
            vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            ::size(&this->_orList);
    if (sVar5 <= uVar4) {
      uVar3 = (*pAStack_20->_vptr_Arg[5])();
      this_local._4_4_ = (uint)((uVar3 & 1) != 0);
      return this_local._4_4_;
    }
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
    __first = std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar6);
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
    __last = std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<TCLAP::Arg**,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>,TCLAP::Arg_const*>
                         (__first._M_current,__last._M_current,&stack0xffffffffffffffe0);
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
    it._M_current = (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
    bVar2 = __gnu_cxx::operator!=(&local_30,&it);
    if (bVar2) break;
    ait._M_current._4_4_ = ait._M_current._4_4_ + 1;
  }
  pvVar6 = std::
           vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
  local_50._M_current =
       (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar6);
  while( true ) {
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
    local_58._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
    bVar2 = __gnu_cxx::operator!=(&local_50,&local_58);
    pAVar1 = pAStack_20;
    if (!bVar2) break;
    ppAVar7 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*(&local_50);
    if (pAVar1 != *ppAVar7) {
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_50);
      bVar2 = Arg::isSet(*ppAVar7);
      if (bVar2) {
        this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_78,"Mutually exclusive argument already set!",&local_79);
        ppAVar7 = __gnu_cxx::
                  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                  ::operator*(&local_50);
        (*(*ppAVar7)->_vptr_Arg[7])(&local_b0);
        CmdLineParseException::CmdLineParseException(this_00,&local_78,&local_b0);
        __cxa_throw(this_00,&CmdLineParseException::typeinfo,
                    CmdLineParseException::~CmdLineParseException);
      }
    }
    it_1._M_current =
         (Arg **)__gnu_cxx::
                 __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                 ::operator++(&local_50,0);
  }
  pvVar6 = std::
           vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
  local_c8._M_current =
       (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar6);
  while( true ) {
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
    local_d0._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
    bVar2 = __gnu_cxx::operator!=(&local_c8,&local_d0);
    pAVar1 = pAStack_20;
    if (!bVar2) break;
    ppAVar7 = __gnu_cxx::
              __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
              ::operator*(&local_c8);
    if (pAVar1 != *ppAVar7) {
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_c8);
      Arg::xorSet(*ppAVar7);
    }
    __gnu_cxx::
    __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>::
    operator++(&local_c8,0);
  }
  ppAVar7 = __gnu_cxx::
            __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
            ::operator*(&local_30);
  uVar3 = (*(*ppAVar7)->_vptr_Arg[0xb])();
  if ((uVar3 & 1) == 0) {
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[](&this->_orList,(long)(int)ait._M_current._4_4_);
    sVar5 = std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::size(pvVar6);
    return (int)sVar5;
  }
  return 0;
}

Assistant:

inline int XorHandler::check( const Arg* a ) 
{
	// iterate over each XOR list
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
	{
		// if the XOR list contains the arg..
		ArgVectorIterator ait = std::find( _orList[i].begin(), 
		                                   _orList[i].end(), a );
		if ( ait != _orList[i].end() )
		{
			// first check to see if a mutually exclusive switch
			// has not already been set
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) && (*it)->isSet() )
					throw(CmdLineParseException(
					      "Mutually exclusive argument already set!",
					      (*it)->toString()));

			// go through and set each arg that is not a
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) )
					(*it)->xorSet();

			// return the number of required args that have now been set
			if ( (*ait)->allowMore() )
				return 0;
			else
				return static_cast<int>(_orList[i].size());
		}
	}

	if ( a->isRequired() )
		return 1;
	else
		return 0;
}